

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

void hydro_random_ensure_initialized(void)

{
  uint8_t *state_u8;
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  long lVar6;
  uchar *dst;
  undefined8 *__buf;
  size_t __nbytes;
  long *in_FS_OFFSET;
  uchar *pnt_;
  pollfd local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  long local_38;
  
  if ((char)in_FS_OFFSET[-1] != '\0') {
    return;
  }
  lVar1 = *in_FS_OFFSET;
  iVar2 = open("/dev/random",0);
  if (iVar2 != -1) {
    local_70.events = 1;
    local_70.revents = 0;
    local_70.fd = iVar2;
    iVar3 = poll(&local_70,1,-1);
    if (iVar3 < 0) {
      piVar4 = __errno_location();
      do {
        if ((*piVar4 != 0xb) && (*piVar4 != 4)) break;
        iVar3 = poll(&local_70,1,-1);
      } while (iVar3 < 0);
    }
    iVar2 = close(iVar2);
    if (iVar3 != 1) {
      piVar4 = __errno_location();
      *piVar4 = 5;
      abort();
    }
    if (iVar2 != 0) goto LAB_0010489a;
  }
  state_u8 = (uint8_t *)(lVar1 + -0x40);
  do {
    iVar2 = open("/dev/urandom",0);
    if (iVar2 != -1) {
      __buf = &local_68;
      __nbytes = 0x38;
      goto LAB_001048ac;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  goto LAB_0010489a;
  while( true ) {
    __buf = (undefined8 *)((long)__buf + sVar5);
    __nbytes = __nbytes - sVar5;
    if (__nbytes == 0) break;
LAB_001048ac:
    sVar5 = read(iVar2,__buf,__nbytes);
    if (sVar5 < 0) {
      piVar4 = __errno_location();
      do {
        if ((*piVar4 != 0xb) && (*piVar4 != 4)) goto LAB_00104904;
        sVar5 = read(iVar2,__buf,__nbytes);
      } while (sVar5 < 0);
    }
    if (sVar5 == 0) break;
  }
  sVar5 = (long)__buf - (long)&local_68;
LAB_00104904:
  iVar3 = -1;
  if (sVar5 == 0x38) {
    local_70 = (pollfd)&local_68;
    *(undefined8 *)(lVar1 + -0x30) = uStack_58;
    *(undefined8 *)(lVar1 + -0x28) = uStack_50;
    *(undefined8 *)(lVar1 + -0x20) = uStack_48;
    *(undefined8 *)(lVar1 + -0x18) = uStack_40;
    *(undefined8 *)state_u8 = local_68;
    *(undefined8 *)(lVar1 + -0x38) = uStack_60;
    *(undefined8 *)(lVar1 + -0x30) = uStack_58;
    *(undefined8 *)(lVar1 + -0x28) = uStack_50;
    in_FS_OFFSET[-2] = local_38;
    lVar6 = 0;
    do {
      *(undefined1 *)((long)local_70 + lVar6) = 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x38);
    iVar3 = 0;
  }
  iVar2 = close(iVar2);
  if (iVar2 == 0 && iVar3 == 0) {
    gimli_core_u8(state_u8,'\0');
    state_u8[0] = '\0';
    state_u8[1] = '\0';
    state_u8[2] = '\0';
    state_u8[3] = '\0';
    state_u8[4] = '\0';
    state_u8[5] = '\0';
    state_u8[6] = '\0';
    state_u8[7] = '\0';
    *(undefined8 *)(lVar1 + -0x38) = 0;
    in_FS_OFFSET[-8] = in_FS_OFFSET[-2];
    in_FS_OFFSET[-2] = in_FS_OFFSET[-2] + 1;
    gimli_core_u8(state_u8,'\0');
    *(undefined2 *)(in_FS_OFFSET + -1) = 0x1001;
    return;
  }
LAB_0010489a:
  abort();
}

Assistant:

static void
hydro_random_ensure_initialized(void)
{
    if (hydro_random_context.initialized == 0) {
        if (hydro_random_init() != 0) {
            abort();
        }
        gimli_core_u8(hydro_random_context.state, 0);
        hydro_random_ratchet();
        hydro_random_context.initialized = 1;
    }
}